

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeymapper.cpp
# Opt level: O0

QList<QKeyCombination> * QKeyMapper::possibleKeys(QKeyEvent *e)

{
  bool bVar1;
  char16_t cVar2;
  int iVar3;
  QKeyCombination k1;
  QPlatformIntegration *debug;
  undefined4 extraout_var;
  iterator o;
  QDebug *pQVar4;
  QKeyEvent *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QList<QKeyCombination> *__range2;
  QPlatformKeyMapper *platformKeyMapper;
  QPlatformIntegration *platformIntegration;
  QList<QKeyCombination> *result;
  QKeySequence keySequence;
  QKeyCombination keyCombination;
  iterator __end2;
  iterator __begin2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QKeyEvent *in_stack_fffffffffffffe18;
  Key in_stack_fffffffffffffe20;
  uint in_stack_fffffffffffffe24;
  QMessageLogger *this_00;
  QKeyCombination in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  QMessageLogger *p;
  QFlagsStorage<Qt::KeyboardModifier> in_stack_fffffffffffffe50;
  SequenceFormat in_stack_fffffffffffffe54;
  QString local_188;
  QKeyCombination in_stack_fffffffffffffe9c;
  QDebug local_130;
  QDebug local_128;
  QDebug local_120;
  QDebug local_118;
  QDebug local_110;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QDebug *in_stack_ffffffffffffff00;
  iterator local_e0 [5];
  QDebug local_b8 [4];
  QChar local_96;
  int local_94;
  int local_74;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  QKeySequence *this;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QtPrivateLogging::lcQpaKeyMapper();
  anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (QLoggingCategory *)in_stack_fffffffffffffe18);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3a9729);
    QMessageLogger::QMessageLogger
              (this_00,(char *)in_RDI,in_stack_fffffffffffffe24,(char *)in_stack_fffffffffffffe18,
               (char *)0x3a9742);
    QMessageLogger::debug();
    QDebug::verbosity(&local_50,3);
    pQVar4 = QDebug::operator<<((QDebug *)
                                CONCAT44(in_stack_fffffffffffffe3c,
                                         in_stack_fffffffffffffe38.combination),(char *)in_RSI);
    QDebug::QDebug(&local_48,pQVar4);
    ::operator<<(in_stack_ffffffffffffff00,
                 (QEvent *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_48);
    QDebug::~QDebug(&local_50);
    local_10 = 0;
  }
  debug = QGuiApplicationPrivate::platformIntegration();
  iVar3 = (*debug->_vptr_QPlatformIntegration[0x18])();
  this = (QKeySequence *)CONCAT44(extraout_var,iVar3);
  in_stack_fffffffffffffe54 = in_stack_fffffffffffffe54 & 0xffffff;
  *(undefined1 **)&in_RDI->context = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->context).file = (char *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->context).function = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(this->d->key + 3))(in_RDI,this,in_RSI);
  bVar1 = QList<QKeyCombination>::isEmpty((QList<QKeyCombination> *)0x3a9837);
  if (bVar1) {
    iVar3 = QKeyEvent::key(in_RSI);
    if ((iVar3 == 0) || (iVar3 = QKeyEvent::key(in_RSI), iVar3 == 0x1ffffff)) {
      QKeyEvent::text(in_stack_fffffffffffffe18);
      bVar1 = QString::isEmpty((QString *)0x3a98a7);
      in_stack_fffffffffffffe24 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe24) ^ 0xff000000;
      QString::~QString((QString *)0x3a98ba);
      if ((in_stack_fffffffffffffe24 & 0x1000000) != 0) {
        QKeyEvent::text(in_stack_fffffffffffffe18);
        local_96 = QString::at((QString *)in_RDI,
                               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        cVar2 = QChar::unicode(&local_96);
        in_stack_fffffffffffffe20 = (Key)(ushort)cVar2;
        in_stack_fffffffffffffe50.i =
             (Int)QKeyEvent::modifiers
                            ((QKeyEvent *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
        local_94 = (int)Qt::operator|(in_stack_fffffffffffffe20,
                                      (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)SUB84(in_RDI,0))
        ;
        QList<QKeyCombination>::operator<<
                  ((QList<QKeyCombination> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                   (rvalue_ref)in_stack_fffffffffffffe18);
        QString::~QString((QString *)0x3a9947);
      }
    }
    else {
      local_74 = (int)QKeyEvent::keyCombination
                                ((QKeyEvent *)
                                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      QList<QKeyCombination>::operator<<
                ((QList<QKeyCombination> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (rvalue_ref)in_stack_fffffffffffffe18);
    }
  }
  QtPrivateLogging::lcQpaKeyMapper();
  bVar1 = QLoggingCategory::isDebugEnabled((QLoggingCategory *)0x3a9958);
  if (bVar1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaKeyMapper();
    anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (QLoggingCategory *)in_stack_fffffffffffffe18);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
      anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3a99b4);
      QMessageLogger::QMessageLogger
                (this_00,(char *)in_RDI,in_stack_fffffffffffffe24,(char *)in_stack_fffffffffffffe18,
                 (char *)0x3a99cd);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)
                         CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38.combination),
                         (char *)in_RSI);
      QDebug::~QDebug(local_b8);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
    local_e0[0].i = (QKeyCombination *)&DAT_aaaaaaaaaaaaaaaa;
    p = in_RDI;
    local_e0[0] = QList<QKeyCombination>::begin
                            ((QList<QKeyCombination> *)
                             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    o = QList<QKeyCombination>::end
                  ((QList<QKeyCombination> *)
                   CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    while (bVar1 = QList<QKeyCombination>::iterator::operator!=(local_e0,o), bVar1) {
      QList<QKeyCombination>::iterator::operator*(local_e0);
      QKeyCombination::fromCombined((int)in_stack_fffffffffffffe18);
      QKeyCombination::fromCombined((int)in_stack_fffffffffffffe18);
      k1 = QKeyCombination::fromCombined((int)in_stack_fffffffffffffe18);
      QKeySequence::QKeySequence
                ((QKeySequence *)in_RDI,k1,in_stack_fffffffffffffe38,
                 (QKeyCombination)(int)((ulong)this_00 >> 0x20),(QKeyCombination)(int)this_00);
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcQpaKeyMapper();
      anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (QLoggingCategory *)in_stack_fffffffffffffe18);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_568c80::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3a9b6e);
        QMessageLogger::QMessageLogger
                  (this_00,(char *)in_RDI,in_stack_fffffffffffffe24,
                   (char *)in_stack_fffffffffffffe18,(char *)0x3a9b87);
        QMessageLogger::debug();
        QDebug::verbosity(&local_130,0);
        pQVar4 = QDebug::operator<<((QDebug *)
                                    CONCAT44(k1.combination,in_stack_fffffffffffffe38.combination),
                                    (char *)in_RSI);
        QDebug::QDebug(&local_128,pQVar4);
        ::operator<<((QDebug *)debug,in_stack_fffffffffffffe9c);
        pQVar4 = QDebug::operator<<((QDebug *)
                                    CONCAT44(k1.combination,in_stack_fffffffffffffe38.combination),
                                    (char *)in_RSI);
        QDebug::QDebug(&local_118,pQVar4);
        ::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50.i),
                     (QKeySequence *)p);
        in_stack_fffffffffffffe18 =
             (QKeyEvent *)
             QDebug::operator<<((QDebug *)
                                CONCAT44(k1.combination,in_stack_fffffffffffffe38.combination),
                                (char *)in_RSI);
        QKeySequence::toString(this,in_stack_fffffffffffffe54);
        QtPrivate::asString(&local_188);
        QString::toUtf8((QString *)in_stack_fffffffffffffe18);
        QByteArray::constData((QByteArray *)0x3a9c82);
        QDebug::operator<<((QDebug *)CONCAT44(k1.combination,in_stack_fffffffffffffe38.combination),
                           (char *)in_RSI);
        QByteArray::~QByteArray((QByteArray *)0x3a9c98);
        QString::~QString((QString *)0x3a9ca2);
        QDebug::~QDebug(&local_110);
        QDebug::~QDebug(&local_118);
        QDebug::~QDebug(&local_120);
        QDebug::~QDebug(&local_128);
        QDebug::~QDebug(&local_130);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      QKeySequence::~QKeySequence
                ((QKeySequence *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      QList<QKeyCombination>::iterator::operator++(local_e0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QKeyCombination> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<QKeyCombination> QKeyMapper::possibleKeys(const QKeyEvent *e)
{
    qCDebug(lcQpaKeyMapper).verbosity(3) << "Computing possible key combinations for" << e;

    const auto *platformIntegration = QGuiApplicationPrivate::platformIntegration();
    const auto *platformKeyMapper = platformIntegration->keyMapper();
    QList<QKeyCombination> result = platformKeyMapper->possibleKeyCombinations(e);

    if (result.isEmpty()) {
        if (e->key() && (e->key() != Qt::Key_unknown))
            result << e->keyCombination();
        else if (!e->text().isEmpty())
            result << (Qt::Key(e->text().at(0).unicode()) | e->modifiers());
    }

#if QT_CONFIG(shortcut)
    if (lcQpaKeyMapper().isDebugEnabled()) {
        qCDebug(lcQpaKeyMapper) << "Resulting possible key combinations:";
        for (auto keyCombination : result) {
            auto keySequence = QKeySequence(keyCombination);
            qCDebug(lcQpaKeyMapper).verbosity(0) << "\t-"
                << keyCombination << "/" << keySequence << "/"
                << qUtf8Printable(keySequence.toString(QKeySequence::NativeText));
        }
    }
#endif

    return result;
}